

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O3

void __thiscall
matchit::impl::IdBlockBase<mathiu::impl::Set>::reset
          (IdBlockBase<mathiu::impl::Set> *this,int32_t depth)

{
  undefined1 local_51;
  ValueVariant<mathiu::impl::Set> *local_50;
  _Variadic_union<std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
  local_48;
  undefined8 local_18;
  
  if (depth <= this->mDepth) {
    local_50 = &this->mVariant;
    local_48._32_8_ = 0;
    local_48._40_8_ = 0;
    local_48._16_8_ = 0;
    local_48._24_8_ = 0;
    local_48._M_rest._M_rest = (_Variadic_union<mathiu::impl::Set_*,_const_mathiu::impl::Set_*>)0x0;
    local_48._8_8_ = 0;
    local_18 = 0;
    std::operator=(&local_50,&local_48,&local_51);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
                         *)&local_48);
    this->mDepth = depth;
  }
  return;
}

Assistant:

constexpr void reset(int32_t depth)
            {
                if (mDepth - depth >= 0)
                {
                    mVariant = {};
                    mDepth = depth;
                }
            }